

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_readDTableX1_wksp_bmi2
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int bmi2)

{
  undefined1 uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  size_t sVar13;
  int iVar14;
  long *plVar15;
  undefined1 uVar16;
  uint uVar17;
  BYTE *huffWeight;
  U32 nbSymbols;
  U32 tableLog;
  
  tableLog = 0;
  nbSymbols = 0;
  sVar13 = 0xffffffffffffffd4;
  if (0x5e7 < wkspSize) {
    huffWeight = (BYTE *)((long)workSpace + 0x4e8);
    sVar3 = HUF_readStats_wksp(huffWeight,0x100,(U32 *)workSpace,&nbSymbols,&tableLog,src,srcSize,
                               (void *)((long)workSpace + 0x80),0x368,bmi2);
    sVar13 = sVar3;
    if (sVar3 < 0xffffffffffffff89) {
      uVar6 = *DTable;
      sVar13 = 0xffffffffffffffd4;
      if (tableLog <= (uVar6 & 0xff) + 1) {
        *(char *)DTable = (char)uVar6;
        *(undefined1 *)((long)DTable + 1) = 0;
        *(char *)((long)DTable + 2) = (char)tableLog;
        *(char *)((long)DTable + 3) = (char)(uVar6 >> 0x18);
        if (-1 < (int)tableLog) {
          lVar9 = 0;
          iVar8 = 0;
          do {
            iVar14 = *(int *)((long)workSpace + lVar9 * 4);
            *(int *)((long)workSpace + lVar9 * 4 + 0x40) = iVar8;
            lVar9 = lVar9 + 1;
            iVar8 = iVar14 + iVar8;
          } while ((ulong)tableLog + 1 != lVar9);
        }
        uVar10 = 0;
        if (3 < (int)nbSymbols) {
          uVar10 = 0;
          do {
            uVar4 = uVar10 & 0xffffffff;
            lVar9 = 0;
            do {
              uVar6 = *(uint *)((long)workSpace + (ulong)huffWeight[lVar9] * 4 + 0x40);
              *(uint *)((long)workSpace + (ulong)huffWeight[lVar9] * 4 + 0x40) = uVar6 + 1;
              *(char *)((long)workSpace + (ulong)uVar6 + 1000) = (char)uVar4;
              lVar9 = lVar9 + 1;
              uVar4 = (ulong)(byte)((char)uVar4 + 1);
            } while (lVar9 != 4);
            uVar10 = uVar10 + 4;
            huffWeight = huffWeight + 4;
          } while ((long)uVar10 < (long)(int)nbSymbols + -3);
        }
        if ((int)uVar10 < (int)nbSymbols) {
          uVar10 = uVar10 & 0xffffffff;
          do {
            uVar4 = (ulong)*(byte *)((long)workSpace + uVar10 + 0x4e8);
            uVar6 = *(uint *)((long)workSpace + uVar4 * 4 + 0x40);
            *(uint *)((long)workSpace + uVar4 * 4 + 0x40) = uVar6 + 1;
            *(char *)((long)workSpace + (ulong)uVar6 + 1000) = (char)uVar10;
            uVar10 = uVar10 + 1;
          } while (nbSymbols != uVar10);
        }
        uVar6 = tableLog + 1;
        sVar13 = sVar3;
        if (1 < uVar6) {
          iVar8 = *workSpace;
          iVar14 = 0;
          uVar10 = 1;
          do {
            uVar2 = *(uint *)((long)workSpace + uVar10 * 4);
            uVar4 = (ulong)uVar2;
            iVar12 = (1 << ((byte)uVar10 & 0x1f)) >> 1;
            uVar17 = uVar6 - (int)uVar10;
            uVar16 = (undefined1)uVar17;
            switch(iVar12) {
            case 1:
              if (0 < (int)uVar2) {
                uVar7 = 0;
                do {
                  *(undefined1 *)((long)DTable + uVar7 * 2 + (long)iVar14 * 2 + 4) =
                       *(undefined1 *)((long)workSpace + uVar7 + (long)iVar8 + 1000);
                  *(undefined1 *)((long)DTable + uVar7 * 2 + (long)iVar14 * 2 + 5) = uVar16;
                  uVar7 = uVar7 + 1;
                } while (uVar4 != uVar7);
              }
              break;
            case 2:
              if (0 < (int)uVar2) {
                lVar9 = (long)iVar14 * 2;
                uVar7 = 0;
                do {
                  uVar1 = *(undefined1 *)((long)workSpace + uVar7 + (long)iVar8 + 1000);
                  *(undefined1 *)((long)DTable + uVar7 * 4 + lVar9 + 4) = uVar1;
                  *(undefined1 *)((long)DTable + uVar7 * 4 + lVar9 + 5) = uVar16;
                  *(undefined1 *)((long)DTable + uVar7 * 4 + lVar9 + 6) = uVar1;
                  *(undefined1 *)((long)DTable + uVar7 * 4 + lVar9 + 7) = uVar16;
                  uVar7 = uVar7 + 1;
                } while (uVar4 != uVar7);
              }
              break;
            default:
              if (0 < (int)uVar2) {
                lVar9 = (long)DTable + (long)iVar14 * 2 + 0x1c;
                uVar7 = 0;
                do {
                  if (0 < iVar12) {
                    lVar11 = (ulong)((uint)*(byte *)((long)workSpace + (long)iVar8 + uVar7 + 1000) |
                                    (uVar17 & 0xff) << 8) * 0x1000100010001;
                    lVar5 = 0;
                    do {
                      *(long *)(lVar9 + -0x18 + lVar5 * 2) = lVar11;
                      *(long *)(lVar9 + -0x10 + lVar5 * 2) = lVar11;
                      *(long *)(lVar9 + -8 + lVar5 * 2) = lVar11;
                      *(long *)(lVar9 + lVar5 * 2) = lVar11;
                      lVar5 = lVar5 + 0x10;
                    } while (lVar5 < iVar12);
                  }
                  uVar7 = uVar7 + 1;
                  lVar9 = lVar9 + (long)iVar12 * 2;
                } while (uVar7 != uVar4);
              }
              break;
            case 4:
              if (0 < (int)uVar2) {
                uVar7 = 0;
                do {
                  *(ulong *)((long)DTable + uVar7 * 8 + (long)iVar14 * 2 + 4) =
                       (ulong)((uint)*(byte *)((long)workSpace + uVar7 + (long)iVar8 + 1000) |
                              (uVar17 & 0xff) << 8) * 0x1000100010001;
                  uVar7 = uVar7 + 1;
                } while (uVar4 != uVar7);
              }
              break;
            case 8:
              if (0 < (int)uVar2) {
                plVar15 = (long *)((long)DTable + (long)iVar14 * 2 + 0xc);
                uVar7 = 0;
                do {
                  lVar9 = (ulong)((uint)*(byte *)((long)workSpace + uVar7 + (long)iVar8 + 1000) |
                                 uVar17 * 0x100 & 0xffff) * 0x1000100010001;
                  plVar15[-1] = lVar9;
                  *plVar15 = lVar9;
                  uVar7 = uVar7 + 1;
                  plVar15 = plVar15 + 2;
                } while (uVar4 != uVar7);
              }
            }
            iVar8 = iVar8 + uVar2;
            iVar14 = iVar14 + iVar12 * uVar2;
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar6);
        }
      }
    }
  }
  return sVar13;
}

Assistant:

size_t HUF_readDTableX1_wksp_bmi2(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize, int bmi2)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX1* const dt = (HUF_DEltX1*)dtPtr;
    HUF_ReadDTableX1_Workspace* wksp = (HUF_ReadDTableX1_Workspace*)workSpace;

    DEBUG_STATIC_ASSERT(HUF_DECOMPRESS_WORKSPACE_SIZE >= sizeof(*wksp));
    if (sizeof(*wksp) > wkspSize) return ERROR(tableLog_tooLarge);

    DEBUG_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* ZSTD_memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->huffWeight, HUF_SYMBOLVALUE_MAX + 1, wksp->rankVal, &nbSymbols, &tableLog, src, srcSize, wksp->statsWksp, sizeof(wksp->statsWksp), bmi2);
    if (HUF_isError(iSize)) return iSize;

    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Compute symbols and rankStart given rankVal:
     *
     * rankVal already contains the number of values of each weight.
     *
     * symbols contains the symbols ordered by weight. First are the rankVal[0]
     * weight 0 symbols, followed by the rankVal[1] weight 1 symbols, and so on.
     * symbols[0] is filled (but unused) to avoid a branch.
     *
     * rankStart contains the offset where each rank belongs in the DTable.
     * rankStart[0] is not filled because there are no entries in the table for
     * weight 0.
     */
    {
        int n;
        int nextRankStart = 0;
        int const unroll = 4;
        int const nLimit = (int)nbSymbols - unroll + 1;
        for (n=0; n<(int)tableLog+1; n++) {
            U32 const curr = nextRankStart;
            nextRankStart += wksp->rankVal[n];
            wksp->rankStart[n] = curr;
        }
        for (n=0; n < nLimit; n += unroll) {
            int u;
            for (u=0; u < unroll; ++u) {
                size_t const w = wksp->huffWeight[n+u];
                wksp->symbols[wksp->rankStart[w]++] = (BYTE)(n+u);
            }
        }
        for (; n < (int)nbSymbols; ++n) {
            size_t const w = wksp->huffWeight[n];
            wksp->symbols[wksp->rankStart[w]++] = (BYTE)n;
        }
    }

    /* fill DTable
     * We fill all entries of each weight in order.
     * That way length is a constant for each iteration of the outter loop.
     * We can switch based on the length to a different inner loop which is
     * optimized for that particular case.
     */
    {
        U32 w;
        int symbol=wksp->rankVal[0];
        int rankStart=0;
        for (w=1; w<tableLog+1; ++w) {
            int const symbolCount = wksp->rankVal[w];
            int const length = (1 << w) >> 1;
            int uStart = rankStart;
            BYTE const nbBits = (BYTE)(tableLog + 1 - w);
            int s;
            int u;
            switch (length) {
            case 1:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart] = D;
                    uStart += 1;
                }
                break;
            case 2:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart+0] = D;
                    dt[uStart+1] = D;
                    uStart += 2;
                }
                break;
            case 4:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    uStart += 4;
                }
                break;
            case 8:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    MEM_write64(dt + uStart + 4, D4);
                    uStart += 8;
                }
                break;
            default:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    for (u=0; u < length; u += 16) {
                        MEM_write64(dt + uStart + u + 0, D4);
                        MEM_write64(dt + uStart + u + 4, D4);
                        MEM_write64(dt + uStart + u + 8, D4);
                        MEM_write64(dt + uStart + u + 12, D4);
                    }
                    assert(u == length);
                    uStart += length;
                }
                break;
            }
            symbol += symbolCount;
            rankStart += symbolCount * length;
        }
    }
    return iSize;
}